

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

BigNum * powMod(BigNum *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  ostream *poVar1;
  double __x;
  double in_XMM1_Qa;
  string moduleStr;
  BigNum module;
  BigNum c;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  BigNum local_138;
  BigNum local_118;
  string local_f8;
  BigNum local_d8;
  BigNum local_b8;
  BigNum local_98;
  BigNum local_78;
  pair<BigNum,_BigNum> local_58;
  
  BigNum::BigNum(&local_98,a);
  BigNum::BigNum(&local_b8,b);
  pow(__x,in_XMM1_Qa);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter module, please:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)&local_158);
  std::__cxx11::string::string((string *)&local_f8,(string *)&local_158);
  BigNum::BigNum(&local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  BigNum::BigNum(&local_118,&local_78);
  BigNum::BigNum(&local_138,&local_d8);
  pairDivMod(&local_58,&local_118,&local_138);
  BigNum::BigNum(__return_storage_ptr__,&local_58.second);
  std::pair<BigNum,_BigNum>::~pair(&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_138);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

BigNum powMod(BigNum a, BigNum b){
    BigNum c = pow(a, b);
    string moduleStr;
    cout << "Enter module, please:" << endl;
    cin >> moduleStr;
    BigNum module = BigNum(moduleStr);
    return pairDivMod(c, module).second;
}